

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utPretransformVertices.cpp
# Opt level: O2

void __thiscall
PretransformVerticesTest_testProcessKeepHierarchy_Test::TestBody
          (PretransformVerticesTest_testProcessKeepHierarchy_Test *this)

{
  PretransformVertices *pPVar1;
  char *pcVar2;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  AssertHelper local_28;
  AssertionResult gtest_ar;
  
  ((this->super_PretransformVerticesTest).mProcess)->configKeepHierarchy = true;
  pPVar1 = (this->super_PretransformVerticesTest).mProcess;
  (*(pPVar1->super_BaseProcess)._vptr_BaseProcess[5])
            (pPVar1,(this->super_PretransformVerticesTest).mScene);
  local_30.ptr_._0_4_ = 5;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,"5U","mScene->mNumMaterials",(uint *)&local_30,
             &((this->super_PretransformVerticesTest).mScene)->mNumMaterials);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_30);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utPretransformVertices.cpp"
               ,0xa0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_30);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_30.ptr_._0_4_ = 0x31;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,"49U","mScene->mNumMeshes",(uint *)&local_30,
             &((this->super_PretransformVerticesTest).mScene)->mNumMeshes);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_30);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utPretransformVertices.cpp"
               ,0xa1,pcVar2);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_30);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(PretransformVerticesTest, testProcessKeepHierarchy) {
    mProcess->KeepHierarchy(true);
    mProcess->Execute(mScene);

    EXPECT_EQ(5U, mScene->mNumMaterials);
    EXPECT_EQ(49U, mScene->mNumMeshes); // see note on mesh 12 above
}